

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElement::~IfcTransportElement(IfcTransportElement *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject + -0x18);
  plVar1 = (long *)(&this->field_0x158 + lVar2);
  plVar1[-0x2b] = 0x8f1328;
  plVar1[7] = 0x8f1418;
  plVar1[-0x1a] = 0x8f1350;
  plVar1[-0x18] = 0x8f1378;
  plVar1[-0x11] = 0x8f13a0;
  plVar1[-0xb] = 0x8f13c8;
  plVar1[-4] = 0x8f13f0;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)
             (&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x0 + lVar2),
             &PTR_construction_vtable_24__008f1430);
  return;
}

Assistant:

IfcTransportElement() : Object("IfcTransportElement") {}